

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
* __thiscall
google::protobuf::json_internal::JsonLexer::ParseUtf8
          (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           *__return_storage_ptr__,JsonLexer *this)

{
  size_t sVar1;
  size_t sVar2;
  MessagePath *pMVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  type tVar7;
  ulong uVar8;
  Status *pSVar9;
  MaybeOwnedString *this_00;
  const_pointer pvVar10;
  string_view sVar11;
  byte local_401;
  char *local_3e8;
  undefined1 local_3b0 [8];
  string_view view;
  Status _status_7;
  StatusOr<google::protobuf::json_internal::MaybeOwnedString> lookahead_bytes;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  undefined1 local_348 [16];
  size_t lookahead;
  string local_320;
  undefined1 local_300 [16];
  undefined1 local_2f0 [21];
  uint8_t uc;
  string local_2d0;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [23];
  char escape;
  Status _status_6;
  StatusOr<unsigned_long> written;
  Status _status_5;
  undefined1 local_268 [7];
  char c_1;
  undefined1 local_258 [8];
  Status _status_4;
  MaybeOwnedString local_248;
  string_view local_218;
  string local_208 [40];
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  undefined1 local_1d0 [8];
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> local_1c8;
  string_view local_178;
  byte local_161;
  string local_160;
  undefined1 local_140 [8];
  MaybeOwnedString result;
  Status _status_3;
  undefined1 local_100 [7];
  char c;
  undefined1 local_f0 [8];
  Status _status_2;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  string on_heap;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined1 local_80 [8];
  Status _status_1;
  JsonLocation loc;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [23];
  bool is_single_quote;
  Status _status;
  JsonLexer *this_local;
  
  _status.rep_ = (uintptr_t)this;
  SkipToToken((JsonLexer *)&stack0xffffffffffffffe0);
  bVar4 = absl::lts_20240722::Status::ok((Status *)&stack0xffffffffffffffe0);
  local_40[0x10] = ((bVar4 ^ 0xffU) & 1) != 0;
  if ((bool)local_40[0x10]) {
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOr<const_absl::lts_20240722::Status,_0>
              (__return_storage_ptr__,(Status *)&stack0xffffffffffffffe0);
  }
  local_40._17_3_ = 0;
  absl::lts_20240722::Status::~Status((Status *)&stack0xffffffffffffffe0);
  if (local_40._16_4_ == 0) {
    cVar5 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
    local_40[0xf] = cVar5 == '\'';
    if ((((this->options_).allow_legacy_syntax & 1U) == 0) && ((bool)local_40[0xf])) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,"expected \'\"\'");
      JsonLocation::SourceLocation::current();
      Invalid((JsonLexer *)local_40,this,local_50._M_len,local_50._M_str);
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_40);
      absl::lts_20240722::Status::~Status((Status *)local_40);
    }
    else {
      _status_1.rep_ = (this->json_loc_).offset;
      sVar1 = (this->json_loc_).line;
      sVar2 = (this->json_loc_).col;
      pMVar3 = (this->json_loc_).path;
      if ((bool)local_40[0xf]) {
        local_3e8 = "\'";
      }
      else {
        local_3e8 = "\"";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,local_3e8);
      JsonLocation::SourceLocation::current();
      Expect((JsonLexer *)local_80,this,local_90._M_len,local_90._M_str);
      bVar4 = absl::lts_20240722::Status::ok((Status *)local_80);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOr<const_absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_80);
      }
      local_40._17_3_ = 0;
      local_40[0x10] = bVar4;
      absl::lts_20240722::Status::~Status((Status *)local_80);
      if (local_40._16_4_ == 0) {
        std::__cxx11::string::string((string *)&mark.loc.path);
        BeginMark((LocationWith<google::protobuf::json_internal::Mark> *)&_status_2,this);
LAB_004a42af:
        do {
          while( true ) {
            ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)local_100,(size_t)this);
            absl::lts_20240722::StatusOr<google::protobuf::json_internal::BufferingGuard>::status
                      ((StatusOr<google::protobuf::json_internal::BufferingGuard> *)local_f0);
            absl::lts_20240722::StatusOr<google::protobuf::json_internal::BufferingGuard>::~StatusOr
                      ((StatusOr<google::protobuf::json_internal::BufferingGuard> *)local_100);
            bVar4 = absl::lts_20240722::Status::ok((Status *)local_f0);
            bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
            if (bVar4) {
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<const_absl::lts_20240722::Status,_0>
                        (__return_storage_ptr__,(Status *)local_f0);
            }
            local_40._17_3_ = 0;
            local_40[0x10] = bVar4;
            absl::lts_20240722::Status::~Status((Status *)local_f0);
            if (local_40._16_4_ != 0) goto LAB_004a50d8;
            bVar6 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
            Advance((JsonLexer *)&result.token_,(size_t)this);
            bVar4 = absl::lts_20240722::Status::ok((Status *)&result.token_);
            bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
            if (bVar4) {
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<const_absl::lts_20240722::Status,_0>
                        (__return_storage_ptr__,(Status *)&result.token_);
            }
            local_40._17_3_ = 0;
            local_40[0x10] = bVar4;
            absl::lts_20240722::Status::~Status((Status *)&result.token_);
            if (local_40._16_4_ != 0) goto LAB_004a50d8;
            if ((bVar6 != 0x22) && (bVar6 != 0x27)) break;
            local_401 = 0x27;
            if ((local_40[0xf] & 1) == 0) {
              local_401 = 0x22;
            }
            if (bVar6 == local_401) {
              uVar8 = std::__cxx11::string::empty();
              local_161 = 0;
              if ((uVar8 & 1) == 0) {
                std::__cxx11::string::string((string *)&local_160,(string *)&mark.loc.path);
                local_161 = 1;
                MaybeOwnedString::MaybeOwnedString((MaybeOwnedString *)local_140,&local_160);
              }
              else {
                Mark::UpToUnread((MaybeOwnedString *)local_140,(Mark *)&_status_2,1);
              }
              if ((local_161 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_160);
              }
              local_178 = MaybeOwnedString::operator_cast_to_basic_string_view
                                    ((MaybeOwnedString *)local_140);
              bVar6 = utf8_range::IsStructurallyValid(local_178._M_len,local_178._M_str);
              if ((bVar6 & 1) == 0) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_1e0,"Invalid UTF-8 string");
                JsonLocation::SourceLocation::current();
                Invalid((JsonLexer *)local_1d0,this,local_1e0._M_len,local_1e0._M_str);
                absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOr<absl::lts_20240722::Status,_0>
                          (__return_storage_ptr__,(Status *)local_1d0);
                absl::lts_20240722::Status::~Status((Status *)local_1d0);
              }
              else {
                MaybeOwnedString::MaybeOwnedString
                          ((MaybeOwnedString *)(local_1d0 + 8),(MaybeOwnedString *)local_140);
                local_1c8.loc.offset = _status_1.rep_;
                local_1c8.loc.line = sVar1;
                local_1c8.loc.col = sVar2;
                local_1c8.loc.path = pMVar3;
                absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>,_0>
                          (__return_storage_ptr__,
                           (LocationWith<google::protobuf::json_internal::MaybeOwnedString> *)
                           (local_1d0 + 8));
                LocationWith<google::protobuf::json_internal::MaybeOwnedString>::~LocationWith
                          ((LocationWith<google::protobuf::json_internal::MaybeOwnedString> *)
                           (local_1d0 + 8));
              }
              local_40._16_4_ = 1;
              MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)local_140);
              goto LAB_004a50d8;
            }
LAB_004a4cee:
            local_2f0[0xd] = bVar6;
            if (((bVar6 < 0x20) || (bVar6 == 0xff)) &&
               (((this->options_).allow_legacy_syntax & 1U) == 0)) {
              absl::lts_20240722::str_format_internal::
              FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::
              FormatSpecTemplate((FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>
                                  *)&stack0xfffffffffffffcd0,
                                 "invalid control character 0x%02x in string");
              absl::lts_20240722::StrFormat<unsigned_char>
                        (&local_320,(FormatSpec<unsigned_char> *)&stack0xfffffffffffffcd0,
                         local_2f0 + 0xd);
              local_300 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_320);
              JsonLocation::SourceLocation::current();
              Invalid((JsonLexer *)local_2f0,this,local_300._0_8_,local_300._8_8_);
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_2f0);
              absl::lts_20240722::Status::~Status((Status *)local_2f0);
              std::__cxx11::string::~string((string *)&local_320);
              local_40._16_4_ = 1;
              goto LAB_004a50d8;
            }
            local_348._8_8_ = 0;
            tVar7 = absl::lts_20240722::countl_one<unsigned_char>(bVar6);
            switch(tVar7) {
            case 0:
              break;
            default:
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_358,"invalid UTF-8 in string");
              JsonLocation::SourceLocation::current();
              Invalid((JsonLexer *)local_348,this,local_358._M_len,local_358._M_str);
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_348);
              absl::lts_20240722::Status::~Status((Status *)local_348);
              local_40._16_4_ = 1;
              goto LAB_004a50d8;
            case 2:
              local_348._8_8_ = 1;
              break;
            case 3:
              local_348._8_8_ = 2;
              break;
            case 4:
              local_348._8_8_ = 3;
            }
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              std::__cxx11::string::push_back((char)&mark + '(');
            }
            ZeroCopyBufferedStream::Take
                      ((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)&_status_7,
                       &this->stream_,local_348._8_8_);
            pSVar9 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::MaybeOwnedString>
                     ::status((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)
                              &_status_7);
            absl::lts_20240722::Status::Status((Status *)&view._M_str,pSVar9);
            bVar4 = absl::lts_20240722::Status::ok((Status *)&view._M_str);
            bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
            if (bVar4) {
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<const_absl::lts_20240722::Status,_0>
                        (__return_storage_ptr__,(Status *)&view._M_str);
            }
            local_40._17_3_ = 0;
            local_40[0x10] = bVar4;
            absl::lts_20240722::Status::~Status((Status *)&view._M_str);
            if (local_40._16_4_ == 0) {
              uVar8 = std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                this_00 = absl::lts_20240722::
                          StatusOr<google::protobuf::json_internal::MaybeOwnedString>::operator->
                                    ((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)
                                     &_status_7);
                sVar11 = MaybeOwnedString::AsView(this_00);
                view._M_len = (size_t)sVar11._M_str;
                local_3b0 = (undefined1  [8])sVar11._M_len;
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0);
                std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0);
                std::__cxx11::string::append((char *)&mark.loc.path,(ulong)pvVar10);
              }
              local_40._16_4_ = 0xc;
            }
            absl::lts_20240722::StatusOr<google::protobuf::json_internal::MaybeOwnedString>::
            ~StatusOr((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)&_status_7);
            if (local_40._16_4_ != 0xc) goto LAB_004a50d8;
          }
          if (bVar6 != 0x5c) goto LAB_004a4cee;
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) != 0) {
            Mark::UpToUnread(&local_248,(Mark *)&_status_2,1);
            sVar11 = MaybeOwnedString::AsView(&local_248);
            local_218 = sVar11;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (local_208,&local_218,(allocator<char> *)((long)&_status_4.rep_ + 7));
            std::__cxx11::string::operator=((string *)&mark.loc.path,local_208);
            std::__cxx11::string::~string(local_208);
            std::allocator<char>::~allocator((allocator<char> *)((long)&_status_4.rep_ + 7));
            MaybeOwnedString::~MaybeOwnedString(&local_248);
            Mark::Discard((Mark *)&_status_2);
          }
          ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)local_268,(size_t)this);
          absl::lts_20240722::StatusOr<google::protobuf::json_internal::BufferingGuard>::status
                    ((StatusOr<google::protobuf::json_internal::BufferingGuard> *)local_258);
          absl::lts_20240722::StatusOr<google::protobuf::json_internal::BufferingGuard>::~StatusOr
                    ((StatusOr<google::protobuf::json_internal::BufferingGuard> *)local_268);
          bVar4 = absl::lts_20240722::Status::ok((Status *)local_258);
          bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
          if (bVar4) {
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr<const_absl::lts_20240722::Status,_0>
                      (__return_storage_ptr__,(Status *)local_258);
          }
          local_40._17_3_ = 0;
          local_40[0x10] = bVar4;
          absl::lts_20240722::Status::~Status((Status *)local_258);
          if (local_40._16_4_ != 0) break;
          _status_5.rep_._7_1_ = ZeroCopyBufferedStream::PeekChar(&this->stream_);
          Advance((JsonLexer *)&written.super_StatusOrData<unsigned_long>.field_1,(size_t)this);
          bVar4 = absl::lts_20240722::Status::ok
                            ((Status *)&written.super_StatusOrData<unsigned_long>.field_1);
          bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
          if (bVar4) {
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr<const_absl::lts_20240722::Status,_0>
                      (__return_storage_ptr__,
                       (Status *)&written.super_StatusOrData<unsigned_long>.field_1);
          }
          local_40._17_3_ = 0;
          local_40[0x10] = bVar4;
          absl::lts_20240722::Status::~Status
                    ((Status *)&written.super_StatusOrData<unsigned_long>.field_1);
          if (local_40._16_4_ != 0) break;
          if ((_status_5.rep_._7_1_ != 'u') &&
             ((_status_5.rep_._7_1_ != 'U' || (((this->options_).allow_legacy_syntax & 1U) == 0))))
          {
            local_2a0[0xf] =
                 ParseSimpleEscape(_status_5.rep_._7_1_,
                                   (bool)((this->options_).allow_legacy_syntax & 1));
            if (local_2a0[0xf] == '\0') {
              absl::lts_20240722::str_format_internal::
              FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)131067>::
              FormatSpecTemplate((FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)131067>
                                  *)(local_2f0 + 0x10),"invalid escape char: \'%c\'");
              absl::lts_20240722::StrFormat<char>
                        (&local_2d0,(FormatSpec<char> *)(local_2f0 + 0x10),
                         (char *)((long)&_status_5.rep_ + 7));
              local_2b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_2d0);
              JsonLocation::SourceLocation::current();
              Invalid((JsonLexer *)local_2a0,this,local_2b0._0_8_,local_2b0._8_8_);
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_2a0);
              absl::lts_20240722::Status::~Status((Status *)local_2a0);
              std::__cxx11::string::~string((string *)&local_2d0);
              local_40._16_4_ = 1;
              break;
            }
            std::__cxx11::string::push_back((char)&mark + '(');
            goto LAB_004a42af;
          }
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)&mark.loc.path);
          std::__cxx11::string::size();
          std::__cxx11::string::operator[]((ulong)&mark.loc.path);
          ParseUnicodeEscape((JsonLexer *)&_status_6,(char *)this);
          pSVar9 = absl::lts_20240722::StatusOr<unsigned_long>::status
                             ((StatusOr<unsigned_long> *)&_status_6);
          absl::lts_20240722::Status::Status((Status *)(local_2a0 + 0x10),pSVar9);
          bVar4 = absl::lts_20240722::Status::ok((Status *)(local_2a0 + 0x10));
          bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
          if (bVar4) {
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr<const_absl::lts_20240722::Status,_0>
                      (__return_storage_ptr__,(Status *)(local_2a0 + 0x10));
          }
          local_40._17_3_ = 0;
          local_40[0x10] = bVar4;
          absl::lts_20240722::Status::~Status((Status *)(local_2a0 + 0x10));
          if (local_40._16_4_ == 0) {
            std::__cxx11::string::size();
            absl::lts_20240722::StatusOr<unsigned_long>::operator*
                      ((StatusOr<unsigned_long> *)&_status_6);
            std::__cxx11::string::resize((ulong)&mark.loc.path);
            local_40._16_4_ = 0;
          }
          absl::lts_20240722::StatusOr<unsigned_long>::~StatusOr
                    ((StatusOr<unsigned_long> *)&_status_6);
        } while (local_40._16_4_ == 0);
LAB_004a50d8:
        LocationWith<google::protobuf::json_internal::Mark>::~LocationWith
                  ((LocationWith<google::protobuf::json_internal::Mark> *)&_status_2);
        std::__cxx11::string::~string((string *)&mark.loc.path);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<LocationWith<MaybeOwnedString>> JsonLexer::ParseUtf8() {
  RETURN_IF_ERROR(SkipToToken());
  // This is a non-standard extension accepted by the ESF parser that we will
  // need to accept for backwards-compat.
  bool is_single_quote = stream_.PeekChar() == '\'';
  if (!options_.allow_legacy_syntax && is_single_quote) {
    return Invalid("expected '\"'");
  }

  JsonLocation loc = json_loc_;
  RETURN_IF_ERROR(Expect(is_single_quote ? "'" : "\""));

  // on_heap is empty if we do not need to heap-allocate the string.
  std::string on_heap;
  LocationWith<Mark> mark = BeginMark();
  while (true) {
    RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

    char c = stream_.PeekChar();
    RETURN_IF_ERROR(Advance(1));
    switch (c) {
      case '"':
      case '\'': {
        if (c != (is_single_quote ? '\'' : '"')) {
          goto normal_character;
        }

        // NOTE: the 1 below clips off the " from the end of the string.
        MaybeOwnedString result = on_heap.empty()
                                      ? mark.value.UpToUnread(1)
                                      : MaybeOwnedString{std::move(on_heap)};
        if (utf8_range::IsStructurallyValid(result)) {
          return LocationWith<MaybeOwnedString>{std::move(result), loc};
        }
        return Invalid("Invalid UTF-8 string");
      }
      case '\\': {
        if (on_heap.empty()) {
          // The 1 skips over the `\`.
          on_heap = std::string(mark.value.UpToUnread(1).AsView());
          // Clang-tidy incorrectly notes this as being moved-from multiple
          // times, but it can only occur in one loop iteration. The mark is
          // destroyed only if we need to handle an escape when on_heap is
          // empty. Because this branch unconditionally pushes to on_heap, this
          // condition can never be reached in any iteration that follows it.
          // Thus, at most one move ever actually occurs.
          std::move(mark).value.Discard();
        }
        RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

        char c = stream_.PeekChar();
        RETURN_IF_ERROR(Advance(1));
        if (c == 'u' || (c == 'U' && options_.allow_legacy_syntax)) {
          // Ensure there is actual space to scribble the UTF-8 onto.
          on_heap.resize(on_heap.size() + 4);
          auto written = ParseUnicodeEscape(&on_heap[on_heap.size() - 4]);
          RETURN_IF_ERROR(written.status());
          on_heap.resize(on_heap.size() - 4 + *written);
        } else {
          char escape = ParseSimpleEscape(c, options_.allow_legacy_syntax);
          if (escape == 0) {
            return Invalid(absl::StrFormat("invalid escape char: '%c'", c));
          }
          on_heap.push_back(escape);
        }
        break;
      }
      normal_character:
      default: {
        uint8_t uc = static_cast<uint8_t>(c);
        // If people have newlines in their strings, that's their problem; it
        // is too difficult to support correctly in our location tracking, and
        // is out of spec, so users will get slightly wrong locations in errors.
        if ((uc < 0x20 || uc == 0xff) && !options_.allow_legacy_syntax) {
          return Invalid(absl::StrFormat(
              "invalid control character 0x%02x in string", uc));
        }

        // Process this UTF-8 code point. We do not need to fully validate it
        // at this stage; we just need to interpret it enough to know how many
        // bytes to read. UTF-8 is a varint encoding satisfying one of the
        // following (big-endian) patterns:
        //
        // 0b0xxxxxxx
        // 0b110xxxxx'10xxxxxx
        // 0b1110xxxx'10xxxxxx'10xxxxxx
        // 0b11110xxx'10xxxxxx'10xxxxxx'10xxxxxx
        size_t lookahead = 0;
        switch (absl::countl_one(uc)) {
          case 0:
            break;
          case 2:
            lookahead = 1;
            break;
          case 3:
            lookahead = 2;
            break;
          case 4:
            lookahead = 3;
            break;
          default:
            return Invalid("invalid UTF-8 in string");
        }

        if (!on_heap.empty()) {
          on_heap.push_back(c);
        }
        auto lookahead_bytes = stream_.Take(lookahead);
        RETURN_IF_ERROR(lookahead_bytes.status());
        if (!on_heap.empty()) {
          absl::string_view view = lookahead_bytes->AsView();
          on_heap.append(view.data(), view.size());
        }
        break;
      }
    }
  }

  return Invalid("EOF inside string");
}